

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgesturemanager.cpp
# Opt level: O1

bool __thiscall QGestureManager::filterEvent(QGestureManager *this,QWidget *receiver,QEvent *event)

{
  _Rb_tree_node_base *args;
  long lVar1;
  bool bVar2;
  _Rb_tree_node_base *p_Var3;
  _Rb_tree_node_base *p_Var4;
  QWidget *pQVar5;
  long lVar6;
  long in_FS_OFFSET;
  QVarLengthArray<Qt::GestureType,_16LL> types;
  undefined8 local_a8;
  QMultiMap<QObject_*,_Qt::GestureType> local_a0;
  QVLABase<Qt::GestureType> local_98;
  undefined1 *puStack_80;
  undefined1 *local_78;
  undefined1 *puStack_70;
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_98.super_QVLABaseBase.ptr = &puStack_80;
  puStack_80 = &DAT_aaaaaaaaaaaaaaaa;
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
  local_78 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
  local_98.super_QVLABaseBase.a = 0x10;
  local_98.super_QVLABaseBase.s = 0;
  local_a0.d.d.ptr =
       (QExplicitlySharedDataPointerV2<QMapData<std::multimap<QObject_*,_Qt::GestureType,_std::less<QObject_*>,_std::allocator<std::pair<QObject_*const,_Qt::GestureType>_>_>_>_>
        )(totally_ordered_wrapper<QMapData<std::multimap<QObject_*,_Qt::GestureType,_std::less<QObject_*>,_std::allocator<std::pair<QObject_*const,_Qt::GestureType>_>_>_>_*>
          )0x0;
  lVar1 = *(long *)(*(long *)&receiver->field_0x8 + 0x238);
  if ((lVar1 != 0) && (*(long *)(lVar1 + 0x30) != 0)) {
    if (lVar1 == 0) {
      p_Var3 = (_Rb_tree_node_base *)0x0;
    }
    else {
      p_Var3 = *(_Rb_tree_node_base **)(lVar1 + 0x20);
    }
    p_Var4 = (_Rb_tree_node_base *)(lVar1 + 0x10);
    if (lVar1 == 0) {
      p_Var4 = (_Rb_tree_node_base *)0x0;
    }
    if (p_Var3 != p_Var4) {
      do {
        args = p_Var3 + 1;
        if (local_98.super_QVLABaseBase.s == local_98.super_QVLABaseBase.a) {
          local_a8 = (QWidget *)CONCAT44(local_a8._4_4_,args->_M_color);
          QVLABase<Qt::GestureType>::emplace_back_impl<Qt::GestureType>
                    (&local_98,0x10,&puStack_80,(GestureType *)&local_a8);
        }
        else {
          QVLABase<Qt::GestureType>::emplace_back_impl<Qt::GestureType_const&>
                    (&local_98,0x10,&puStack_80,&args->_M_color);
        }
        local_a8 = receiver;
        QMultiMap<QObject_*,_Qt::GestureType>::insert
                  (&local_a0,(QObject **)&local_a8,&args->_M_color);
        p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3);
      } while (p_Var3 != p_Var4);
    }
  }
  if (((receiver->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
       super_QFlagsStorage<Qt::WindowType>.i & 1) == 0) {
    pQVar5 = *(QWidget **)(*(long *)&receiver->field_0x8 + 0x10);
  }
  else {
    pQVar5 = (QWidget *)0x0;
  }
  if (pQVar5 != (QWidget *)0x0) {
    do {
      lVar1 = *(long *)(*(long *)&pQVar5->field_0x8 + 0x238);
      if (lVar1 == 0) {
        p_Var3 = (_Rb_tree_node_base *)0x0;
      }
      else {
        p_Var3 = *(_Rb_tree_node_base **)(lVar1 + 0x20);
      }
      p_Var4 = (_Rb_tree_node_base *)(lVar1 + 0x10);
      if (lVar1 == 0) {
        p_Var4 = (_Rb_tree_node_base *)0x0;
      }
      for (; p_Var3 != p_Var4; p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
        if ((p_Var3[1].field_0x4 & 1) == 0) {
          lVar1 = local_98.super_QVLABaseBase.s * 4;
          do {
            lVar6 = lVar1;
            if (lVar6 == 0) goto LAB_002d731f;
            lVar1 = lVar6 + -4;
          } while (*(_Rb_tree_color *)((long)local_98.super_QVLABaseBase.ptr + lVar6 + -4) !=
                   p_Var3[1]._M_color);
          if (lVar6 == 0) {
LAB_002d731f:
            if (local_98.super_QVLABaseBase.s == local_98.super_QVLABaseBase.a) {
              local_a8._4_4_ = (undefined4)((ulong)local_a8 >> 0x20);
              local_a8 = (QWidget *)CONCAT44(local_a8._4_4_,p_Var3[1]._M_color);
              QVLABase<Qt::GestureType>::emplace_back_impl<Qt::GestureType>
                        (&local_98,0x10,&puStack_80,(GestureType *)&local_a8);
            }
            else {
              QVLABase<Qt::GestureType>::emplace_back_impl<Qt::GestureType_const&>
                        (&local_98,0x10,&puStack_80,&p_Var3[1]._M_color);
            }
            local_a8 = pQVar5;
            QMultiMap<QObject_*,_Qt::GestureType>::insert
                      (&local_a0,(QObject **)&local_a8,&p_Var3[1]._M_color);
          }
        }
      }
    } while ((((pQVar5->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
               super_QFlagsStorage<Qt::WindowType>.i & 1) == 0) &&
            (pQVar5 = *(QWidget **)(*(long *)&pQVar5->field_0x8 + 0x10), pQVar5 != (QWidget *)0x0));
  }
  if ((local_a0.d.d.ptr ==
       (totally_ordered_wrapper<QMapData<std::multimap<QObject_*,_Qt::GestureType,_std::less<QObject_*>,_std::allocator<std::pair<QObject_*const,_Qt::GestureType>_>_>_>_*>
        )0x0) || (*(size_t *)((long)local_a0.d.d.ptr + 0x30) == 0)) {
    bVar2 = false;
  }
  else {
    bVar2 = filterEventThroughContexts(this,&local_a0,event);
  }
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::multimap<QObject_*,_Qt::GestureType,_std::less<QObject_*>,_std::allocator<std::pair<QObject_*const,_Qt::GestureType>_>_>_>_>
  ::~QExplicitlySharedDataPointerV2(&local_a0.d);
  if ((undefined1 **)local_98.super_QVLABaseBase.ptr != &puStack_80) {
    QtPrivate::sizedFree(local_98.super_QVLABaseBase.ptr,local_98.super_QVLABaseBase.a << 2);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool QGestureManager::filterEvent(QWidget *receiver, QEvent *event)
{
    QVarLengthArray<Qt::GestureType, 16> types;
    QMultiMap<QObject *, Qt::GestureType> contexts;
    QWidget *w = receiver;
    typedef QMap<Qt::GestureType, Qt::GestureFlags>::const_iterator ContextIterator;
    if (!w->d_func()->gestureContext.isEmpty()) {
        for(ContextIterator it = w->d_func()->gestureContext.constBegin(),
            e = w->d_func()->gestureContext.constEnd(); it != e; ++it) {
            types.push_back(it.key());
            contexts.insert(w, it.key());
        }
    }
    // find all gesture contexts for the widget tree
    w = w->isWindow() ? nullptr : w->parentWidget();
    while (w)
    {
        for (ContextIterator it = w->d_func()->gestureContext.constBegin(),
             e = w->d_func()->gestureContext.constEnd(); it != e; ++it) {
            if (!(it.value() & Qt::DontStartGestureOnChildren)) {
                if (!types.contains(it.key())) {
                    types.push_back(it.key());
                    contexts.insert(w, it.key());
                }
            }
        }
        if (w->isWindow())
            break;
        w = w->parentWidget();
    }
    return contexts.isEmpty() ? false : filterEventThroughContexts(contexts, event);
}